

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdshemu.c
# Opt level: O3

SHEMU_STATUS ShemuMemLoad(SHEMU_CONTEXT *Context,ND_UINT64 Gla,ND_UINT64 Size,ND_UINT8 *Value)

{
  ulong uVar1;
  ND_UINT8 *pNVar2;
  ND_BOOL NVar3;
  ulong uVar4;
  ND_UINT64 NVar5;
  ND_UINT64 NVar6;
  
  uVar4 = Context->ShellcodeBase;
  if (uVar4 <= Gla) {
    uVar1 = Context->ShellcodeSize + uVar4;
    if ((((Gla < uVar1) && (Size <= Context->ShellcodeSize)) && (uVar4 < Size + Gla)) &&
       (Size + Gla <= uVar1)) {
      if ((Context->Options & 0x20) != 0) {
        if (Context->AccessShellcode == (ShemuMemAccess)0x0) {
          return 1;
        }
        NVar3 = (*Context->AccessShellcode)(Context,Gla,Size,Value,'\0');
        if (NVar3 != '\0') {
          return 0;
        }
        return 1;
      }
      if (Size == 0) {
        return 0;
      }
      if (Value == (ND_UINT8 *)0x0) {
        return 0;
      }
      pNVar2 = Context->Shellcode;
      if (pNVar2 + (Gla - uVar4) == (ND_UINT8 *)0x0) {
        return 0;
      }
      NVar5 = 0;
      do {
        Value[NVar5] = (pNVar2 + (Gla - uVar4))[NVar5];
        NVar5 = NVar5 + 1;
      } while (Size != NVar5);
      return 0;
    }
  }
  uVar4 = Context->StackBase;
  if (uVar4 <= Gla) {
    uVar1 = Context->StackSize + uVar4;
    if (((Gla < uVar1) && (Size <= Context->StackSize)) &&
       ((uVar4 < Size + Gla && (Size + Gla <= uVar1)))) {
      if (Size == 0) {
        return 0;
      }
      if (Value == (ND_UINT8 *)0x0) {
        return 0;
      }
      pNVar2 = Context->Stack;
      if (pNVar2 + (Gla - uVar4) == (ND_UINT8 *)0x0) {
        return 0;
      }
      NVar5 = 0;
      do {
        Value[NVar5] = (pNVar2 + (Gla - uVar4))[NVar5];
        NVar5 = NVar5 + 1;
      } while (Size != NVar5);
      return 0;
    }
  }
  uVar4 = Context->ExtMemAccess + 1;
  Context->ExtMemAccess = uVar4;
  if (((uVar4 <= Context->MemThreshold) && (Context->AccessMemory != (ShemuMemAccess)0x0)) &&
     (NVar3 = (*Context->AccessMemory)(Context,Gla,Size,Value,'\0'), NVar3 != '\0')) {
    return 0;
  }
  if (Context->ArchType != SHEMU_ARCH_TYPE_X86) {
    return 7;
  }
  NVar5 = Context->TibBase;
  NVar6 = NVar5 + 0x30;
  if ((Context->Arch).X86.Mode == '\x01') {
    NVar6 = NVar5 + 0x18;
  }
  if (NVar6 == Gla) {
    if (Size == 8) {
      *(ND_UINT64 *)Value = NVar5;
    }
    else {
      if (Size != 4) {
        return 1;
      }
      *(int *)Value = (int)NVar5;
    }
    return 0;
  }
  return 1;
}

Assistant:

SHEMU_STATUS
ShemuMemLoad(
    SHEMU_CONTEXT *Context,
    ND_UINT64 Gla,
    ND_UINT64 Size,
    ND_UINT8 *Value
    )
{
    if (ShemuIsShellcodePtr(Context, Gla, Size))
    {
        // Shellcode access.
        if (0 == (Context->Options & SHEMU_OPT_DIRECT_MAPPED_SHELL))
        {
            // Shellocode is local copy, we can directly access it.
            ShemuCopyMem(Value, Context->Shellcode + (Gla - Context->ShellcodeBase), Size);
        }
        else
        {
            // Shellcode is directly mapped, we must go through the shellcode access API.
            if ((ND_NULL == Context->AccessShellcode) ||
                !Context->AccessShellcode(Context, Gla, (ND_SIZET)Size, Value, ND_FALSE))
            {
                return SHEMU_ABORT_GLA_OUTSIDE;
            }
        }
    }
    else if (ShemuIsStackPtr(Context, Gla, Size))
    {
        ShemuCopyMem(Value, Context->Stack + (Gla - Context->StackBase), Size);
    }
    else
    {
        ND_UINT32 selfOffset = 0;
        ND_BOOL res = ND_FALSE;

        // We allow a maximum number of external memory accesses, due to performance reasons.
        if (++Context->ExtMemAccess > Context->MemThreshold)
        {
            goto _check_special_access;
        }

        // NOTE: The accessed GLA may partially access an internal address (shellcode or stack) and an external address.
        // Since the AccessMemory callback can be provided with the full SHEMU_CONTEXT, the integrator can choose how
        // to handle those accesses; some options are:
        // - Don't handle them at all, and return error (ND_FALSE);
        // - Handle them by reading the actual memory value; this has the disadvantage that if the shellcode/stack 
        //   portion has been modified due to emulation, the AccessMemory function would return the original memory 
        //   value;
        // - Handle them properly, by returning the emulated values for the internal addresses, and the external
        //   values for the external addresses.
        // bdshemu does not care directly about this, and lets the integrator choose his own strategy.
        if (ND_NULL != Context->AccessMemory)
        {
            res = Context->AccessMemory(Context, Gla, (ND_SIZET)Size, Value, ND_FALSE);
        }

        if (res)
        {
            return SHEMU_SUCCESS;
        }
        
    _check_special_access:
        if (Context->ArchType == SHEMU_ARCH_TYPE_X86)
        {
            selfOffset = Context->Arch.X86.Mode == ND_CODE_32 ? 0x18 : 0x30;
        }
        else
        {
            return SHEMU_ABORT_INVALID_PARAMETER;
        }

        // If we got here, the external memory access has not been handled.
        if (Gla == Context->TibBase + selfOffset)
        {
            // TEB.Self access.
            if (Size == 4)
            {
                *(ND_UINT32*)Value = (ND_UINT32)Context->TibBase;
                return SHEMU_SUCCESS;
            }
            else if (Size == 8)
            {
                *(ND_UINT64*)Value = (ND_UINT64)Context->TibBase;
                return SHEMU_SUCCESS;
            }
        }

        return SHEMU_ABORT_GLA_OUTSIDE;
    }

    return SHEMU_SUCCESS;
}